

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getHighsStringOptionValue(void *highs,char *option,char *value)

{
  HighsInt HVar1;
  char *in_stack_ffffffffffffff68;
  allocator *highs_00;
  string *alt_method_name;
  string *in_stack_ffffffffffffff88;
  Highs *in_stack_ffffffffffffff90;
  undefined1 local_39 [57];
  
  alt_method_name = (string *)local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_39 + 1),"Highs_getHighsStringOptionValue",(allocator *)alt_method_name
            );
  highs_00 = (allocator *)&stack0xffffffffffffff8f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff90,"Highs_getStringOptionValue",highs_00);
  Highs::deprecationMessage(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,alt_method_name);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  HVar1 = Highs_getStringOptionValue(highs_00,in_stack_ffffffffffffff68,(char *)0x43d9f5);
  return HVar1;
}

Assistant:

HighsInt Highs_getHighsStringOptionValue(const void* highs, const char* option,
                                         char* value) {
  ((Highs*)highs)
      ->deprecationMessage("Highs_getHighsStringOptionValue",
                           "Highs_getStringOptionValue");
  return Highs_getStringOptionValue(highs, option, value);
}